

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O2

int Ssw_ManSweepBmcFilter(Ssw_Man_t *p,int TimeLimit)

{
  Ssw_Pars_t *pSVar1;
  int iVar2;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t **ppAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *p1;
  abctime aVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  char *format;
  Ssw_Man_t *p_00;
  Ssw_Cla_t *p_01;
  int iVar14;
  
  aVar3 = Abc_Clock();
  pAVar4 = Aig_ManStart(p->pPars->nFramesK * p->pAig->vObjs->nSize);
  p->pFrames = pAVar4;
  for (iVar11 = 0; pAVar4 = p->pAig, iVar11 < pAVar4->nRegs; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(pAVar4->vCis,pAVar4->nTruePis + iVar11);
    uVar10 = p->pAig->nTruePis + iVar11;
    pAVar7 = p->pFrames->pConst1;
    pAVar8 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
    if ((p->pPatWords[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) {
      pAVar8 = pAVar7;
    }
    p->pNodeToFrames[(long)*(int *)((long)pvVar5 + 0x24) * (long)p->nFrames] = pAVar8;
  }
  uVar13 = 0;
  do {
    iVar11 = (int)uVar13;
    if (p->pPars->nFramesK <= iVar11) {
      return 1;
    }
    iVar14 = p->nFrames;
    if (iVar11 == iVar14 + -1) {
      ppAVar6 = (Aig_Obj_t **)calloc((long)(pAVar4->vObjs->nSize * iVar14 * 2),8);
      for (iVar12 = 0; iVar12 < iVar14; iVar12 = iVar12 + 1) {
        for (iVar14 = 0; iVar14 < pAVar4->vObjs->nSize; iVar14 = iVar14 + 1) {
          pvVar5 = Vec_PtrEntry(pAVar4->vObjs,iVar14);
          if (pvVar5 != (void *)0x0) {
            iVar2 = *(int *)((long)pvVar5 + 0x24) * p->nFrames;
            ppAVar6[iVar12 + iVar2 * 2] = p->pNodeToFrames[iVar2 + iVar12];
          }
          pAVar4 = p->pAig;
        }
        iVar14 = p->nFrames;
      }
      if (p->pNodeToFrames != (Aig_Obj_t **)0x0) {
        free(p->pNodeToFrames);
        iVar14 = p->nFrames;
        pAVar4 = p->pAig;
      }
      p->pNodeToFrames = ppAVar6;
      iVar14 = iVar14 * 2;
      p->nFrames = iVar14;
    }
    else {
      ppAVar6 = p->pNodeToFrames;
    }
    ppAVar6[iVar14 * pAVar4->pConst1->Id + iVar11] = p->pFrames->pConst1;
    for (iVar14 = 0; pAVar4 = p->pAig, iVar14 < pAVar4->nTruePis; iVar14 = iVar14 + 1) {
      pvVar5 = Vec_PtrEntry(pAVar4->vCis,iVar14);
      pAVar7 = Aig_ObjCreateCi(p->pFrames);
      p->pNodeToFrames[*(int *)((long)pvVar5 + 0x24) * p->nFrames + iVar11] = pAVar7;
    }
    for (iVar14 = 0; p_00 = (Ssw_Man_t *)pAVar4->vObjs, iVar14 < *(int *)((long)&p_00->pPars + 4);
        iVar14 = iVar14 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,iVar14);
      if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7)) {
        pAVar4 = p->pFrames;
        pAVar8 = Ssw_ObjChild0Fra(p,pAVar7,iVar11);
        p1 = Ssw_ObjChild1Fra(p,pAVar7,iVar11);
        pAVar8 = Aig_And(pAVar4,pAVar8,p1);
        p->pNodeToFrames[pAVar7->Id * p->nFrames + iVar11] = pAVar8;
        p_00 = p;
        iVar12 = Ssw_ManSweepNodeFilter(p,pAVar7,iVar11);
        if (iVar12 != 0) break;
      }
      pAVar4 = p->pAig;
    }
    iVar12 = (int)p_00;
    if (p->pPars->fVerbose != 0) {
      Abc_Print(iVar12,"Frame %4d : ",uVar13);
      p_01 = p->ppClasses;
      Ssw_ClassesPrint(p_01,0);
      iVar12 = (int)p_01;
    }
    pSVar1 = p->pPars;
    if (iVar14 < p->pAig->vObjs->nSize) {
      if (pSVar1->fVerbose == 0) {
        return 1;
      }
      uVar10 = pSVar1->nBTLimit;
      format = "Exceeded the resource limits (%d conflicts). Quitting...\n";
LAB_004e80f1:
      Abc_Print(iVar12,format,(ulong)uVar10);
      return 1;
    }
    uVar10 = pSVar1->nFramesK;
    if (iVar11 == uVar10 - 1) {
      if (pSVar1->fVerbose == 0) {
        return 1;
      }
      format = "Exceeded the time frame limit (%d time frames). Quitting...\n";
      goto LAB_004e80f1;
    }
    if ((TimeLimit != 0) &&
       (aVar9 = Abc_Clock(), (float)TimeLimit <= (float)(aVar9 - aVar3) / 1e+06)) {
      return 1;
    }
    iVar14 = 0;
    while( true ) {
      pAVar4 = p->pAig;
      if (pAVar4->vCos->nSize <= iVar14) break;
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(pAVar4->vCos,iVar14);
      pAVar8 = Ssw_ObjChild0Fra(p,pAVar7,iVar11);
      p->pNodeToFrames[pAVar7->Id * p->nFrames + iVar11] = pAVar8;
      iVar14 = iVar14 + 1;
    }
    uVar13 = (ulong)(iVar11 + 1U);
    for (iVar14 = 0; iVar14 < pAVar4->nRegs; iVar14 = iVar14 + 1) {
      pAVar7 = Saig_ManLi(pAVar4,iVar14);
      pAVar8 = Saig_ManLo(p->pAig,iVar14);
      pAVar7 = p->pNodeToFrames[pAVar7->Id * p->nFrames + iVar11];
      p->pNodeToFrames[(int)(p->nFrames * pAVar8->Id + iVar11 + 1U)] = pAVar7;
      Ssw_CnfNodeAddToSolver(p->pMSat,(Aig_Obj_t *)((ulong)pAVar7 & 0xfffffffffffffffe));
      pAVar4 = p->pAig;
    }
  } while( true );
}

Assistant:

int Ssw_ManSweepBmcFilter( Ssw_Man_t * p, int TimeLimit )
{
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int f, f1, i;
    abctime clkTotal = Abc_Clock();
    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        if ( Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i ) )
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst1(p->pFrames) );
//Abc_Print( 1, "1" );
        }
        else
        {
            Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );
//Abc_Print( 1, "0" );
        }
    }
//Abc_Print( 1, "\n" );

    // sweep internal nodes
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // realloc mapping of timeframes
        if ( f == p->nFrames-1 )
        {
            Aig_Obj_t ** pNodeToFrames;
            pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * 2 * p->nFrames );
            for ( f1 = 0; f1 < p->nFrames; f1++ )
            {
                Aig_ManForEachObj( p->pAig, pObj, i )
                    pNodeToFrames[2*p->nFrames*pObj->Id + f1] = Ssw_ObjFrame( p, pObj, f1 );
            }
            ABC_FREE( p->pNodeToFrames );
            p->pNodeToFrames = pNodeToFrames;
            p->nFrames *= 2;
        }
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            if ( Ssw_ManSweepNodeFilter( p, pObj, f ) )
                break;
        }
        // printout
        if ( p->pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d : ", f );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        if ( i < Vec_PtrSize(p->pAig->vObjs) )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the resource limits (%d conflicts). Quitting...\n", p->pPars->nBTLimit );
            break;
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
        {
            if ( p->pPars->fVerbose )
                Abc_Print( 1, "Exceeded the time frame limit (%d time frames). Quitting...\n", p->pPars->nFramesK );
            break;
        }
        // check timeout
        if ( TimeLimit && ((float)TimeLimit <= (float)(Abc_Clock()-clkTotal)/(float)(CLOCKS_PER_SEC)) )
            break;
        // transfer latch input to the latch outputs 
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    // verify
//    Ssw_ClassesCheck( p->ppClasses );
    return 1;
}